

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexo.h
# Opt level: O3

rx_status rx_handle_test_result
                    (rx_context *context,int result,char *file,int line,rx_severity severity,
                    char *failure_msg,char *diagnostic_msg)

{
  long *plVar1;
  ulong *__ptr;
  long lVar2;
  ulong uVar3;
  rx_status rVar4;
  ulong *puVar5;
  ulong uVar6;
  char *pcVar7;
  rx_status rVar8;
  undefined4 in_register_00000034;
  char *pcVar9;
  char *file_00;
  char *original;
  undefined4 in_register_00000084;
  ulong uVar10;
  char *buf;
  char *local_48;
  char *local_40;
  char *local_38;
  
  original = (char *)CONCAT44(in_register_00000084,severity);
  pcVar9 = (char *)CONCAT44(in_register_00000034,result);
  if (context == (rx_context *)0x0) {
    __assert_fail("context->summary != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x186f,
                  "enum rx_status rx_handle_test_result(struct rx_context *, int, const char *, int, enum rx_severity, const char *, const char *)"
                 );
  }
  lVar2 = context->env[0].__jmpbuf[5];
  if (lVar2 == 0) {
    __assert_fail("context->summary->failures != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x1870,
                  "enum rx_status rx_handle_test_result(struct rx_context *, int, const char *, int, enum rx_severity, const char *, const char *)"
                 );
  }
  plVar1 = context->env[0].__jmpbuf + 3;
  *plVar1 = *plVar1 + 1;
  rVar8 = RX_SUCCESS;
  if (result != 0) {
    return RX_SUCCESS;
  }
  __ptr = (ulong *)(lVar2 + -0x10);
  uVar6 = *(ulong *)(lVar2 + -0x10);
  uVar10 = uVar6 + 1;
  local_38 = failure_msg;
  if (uVar10 >> 0x3b == 0) {
    uVar3 = *(ulong *)(lVar2 + -8);
    puVar5 = __ptr;
    local_40 = file;
    if (uVar3 < uVar10) {
      uVar6 = (uVar3 >> 1) + uVar3 + 1;
      if (uVar6 < uVar3) {
        uVar10 = 0x7ffffffffffffff;
      }
      else if ((uVar10 <= uVar6) && (uVar10 = uVar6, 0x7ffffffffffffff < uVar6)) {
        __assert_fail("new_capacity <= max_capacity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                      ,0x11ed,
                      "enum rx_status rx__dyn_array_ensure_has_enough_capacity(void **, size_t, size_t, size_t, size_t)"
                     );
      }
      pcVar9 = (char *)(uVar10 << 5 | 0x10);
      puVar5 = (ulong *)realloc(__ptr,(size_t)pcVar9);
      if (puVar5 == (ulong *)0x0) {
        rx__log(RX_LOG_LEVEL_ALL,pcVar9,0x11f3,"failed to reallocate the block\n");
        rVar8 = RX_ERROR_ALLOCATION;
        file = local_40;
        goto LAB_00103128;
      }
      puVar5[1] = uVar10;
      uVar6 = *puVar5;
      uVar10 = uVar6 + 1;
    }
    pcVar9 = local_40;
    context->env[0].__jmpbuf[5] = (long)(puVar5 + 2);
    *puVar5 = uVar10;
    context->env[0].__jmpbuf[4] = uVar10;
    file_00 = local_40;
    rVar4 = rx__str_copy(&local_48,local_40);
    pcVar7 = local_48;
    if (rVar4 != RX_SUCCESS) {
      rx__log(RX_LOG_LEVEL_ERROR,file_00,0x1891,
              "failed to allocate the file name for the test located at %s:%d\n",pcVar9,
              (ulong)(uint)line);
      pcVar7 = (char *)0x0;
    }
    puVar5[uVar6 * 4 + 2] = (ulong)pcVar7;
    *(int *)(puVar5 + uVar6 * 4 + 3) = line;
    *(undefined4 *)((long)puVar5 + uVar6 * 0x20 + 0x1c) = 1;
    if (original == (char *)0x0) {
      puVar5[uVar6 * 4 + 4] = 0;
    }
    else {
      rVar4 = rx__str_copy(&local_48,original);
      pcVar9 = local_48;
      if (rVar4 != RX_SUCCESS) {
        rx__log(RX_LOG_LEVEL_ERROR,original,0x18a5,
                "failed to allocate the failure message for the test located at %s:%d\n",local_40,
                (ulong)(uint)line);
        pcVar9 = (char *)0x0;
      }
      puVar5[uVar6 * 4 + 4] = (ulong)pcVar9;
    }
    if (local_38 == (char *)0x0) {
      puVar5[uVar6 * 4 + 5] = 0;
    }
    else {
      pcVar9 = local_38;
      rVar4 = rx__str_copy(&local_48,local_38);
      if (rVar4 != RX_SUCCESS) {
        rx__log(RX_LOG_LEVEL_ERROR,pcVar9,0x18b6,
                "failed to allocate the diagnostic message for the test located at %s:%d\n",local_40
                ,(ulong)(uint)line);
        local_48 = (char *)0x0;
      }
      puVar5[uVar6 * 4 + 5] = (ulong)local_48;
    }
  }
  else {
    rx__log(RX_LOG_LEVEL_ALL,pcVar9,0x11e2,"the requested capacity is too large\n");
    rVar8 = RX_ERROR_MAX_SIZE_EXCEEDED;
LAB_00103128:
    rx__log(RX_LOG_LEVEL_ALL,pcVar9,0x123e,
            "failed to reserve a large enough capacity for the test failure array (requested capacity: %lu)\n"
            ,*__ptr + 1);
    context->env[0].__jmpbuf[2] = (long)"failed to extend the test failure array";
    rx__log(RX_LOG_LEVEL_ERROR,pcVar9,0x1882,
            "failed to extend the test failure array for the test located at %s:%d\n",file,
            (ulong)(uint)line);
  }
  return rVar8;
}

Assistant:

RX__MAYBE_UNUSED RX__STORAGE enum rx_status
rx_handle_test_result(struct rx_context *context,
                      int result,
                      const char *file,
                      int line,
                      enum rx_severity severity,
                      const char *failure_msg,
                      const char *diagnostic_msg)
{
    enum rx_status status;
    struct rx_summary *summary;
    struct rx_failure *failure;
    size_t failure_count;

    RX_ASSERT(context != NULL);
    RX_ASSERT(context->summary != NULL);
    RX_ASSERT(context->summary->failures != NULL);
    RX_ASSERT(file != NULL);

    summary = context->summary;

    ++summary->assessed_count;

    if (result) {
        return RX_SUCCESS;
    }

    status
        = rx__test_failure_array_extend_back(&failure, &summary->failures, 1);
    if (status != RX_SUCCESS) {
        summary->error = "failed to extend the test failure array\0";
        RX__LOG_ERROR_2("failed to extend the test failure array for the test "
                        "located at %s:%d\n",
                        file,
                        line);
        return status;
    }

    rx__test_failure_array_get_size(&failure_count, summary->failures);
    summary->failure_count = failure_count;

    {
        char *buf;

        status = rx__str_copy(&buf, file);
        if (status != RX_SUCCESS) {
            RX__LOG_ERROR_2("failed to allocate the file name for the test "
                            "located at %s:%d\n",
                            file,
                            line);
            failure->file = NULL;
        } else {
            failure->file = buf;
        }
    }

    failure->line = line;
    failure->severity = severity;

    if (failure_msg == NULL) {
        failure->msg = NULL;
    } else {
        char *buf;

        status = rx__str_copy(&buf, failure_msg);
        if (status != RX_SUCCESS) {
            RX__LOG_ERROR_2("failed to allocate the failure message for "
                            "the test located at %s:%d\n",
                            file,
                            line);
            failure->msg = NULL;
        } else {
            failure->msg = buf;
        }
    }

    if (diagnostic_msg == NULL) {
        failure->diagnostic_msg = NULL;
    } else {
        char *buf;

        status = rx__str_copy(&buf, diagnostic_msg);
        if (status != RX_SUCCESS) {
            RX__LOG_ERROR_2("failed to allocate the diagnostic message for "
                            "the test located at %s:%d\n",
                            file,
                            line);
            failure->diagnostic_msg = NULL;
        } else {
            failure->diagnostic_msg = buf;
        }
    }

    return RX_SUCCESS;
}